

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O1

SiameseResult __thiscall siamese::Decoder::Get(Decoder *this,SiameseOriginalPacket *packetOut)

{
  OriginalPacket *pOVar1;
  DecoderSubwindow *pDVar2;
  SiameseResult SVar3;
  uint uVar4;
  uchar *puVar5;
  uint uVar6;
  
  if ((this->Window).EmergencyDisabled != false) {
    return Siamese_Disabled;
  }
  uVar4 = packetOut->PacketNum - (this->Window).ColumnStart;
  uVar6 = uVar4 & 0x3fffff;
  SVar3 = Siamese_NeedMoreData;
  if (uVar6 < (this->Window).Count) {
    pDVar2 = (this->Window).Subwindows.DataPtr[uVar6 >> 6];
    uVar4 = uVar4 & 0x3f;
    uVar6 = (pDVar2->Originals)._M_elems[uVar4].Buffer.Bytes;
    if (uVar6 != 0) {
      pOVar1 = (pDVar2->Originals)._M_elems + uVar4;
      uVar4 = pOVar1->HeaderBytes;
      uVar6 = uVar6 - uVar4;
      puVar5 = (pOVar1->Buffer).Data + uVar4;
      SVar3 = Siamese_Success;
      goto LAB_00144746;
    }
  }
  puVar5 = (uchar *)0x0;
  uVar6 = 0;
LAB_00144746:
  packetOut->Data = puVar5;
  packetOut->DataBytes = uVar6;
  return SVar3;
}

Assistant:

SiameseResult Decoder::Get(SiameseOriginalPacket& packetOut)
{
    // Note: Keep this in sync with Encoder::Get

    if (Window.EmergencyDisabled) {
        return Siamese_Disabled;
    }

    // Note: This also works when Count == 0
    const unsigned element = Window.ColumnToElement(packetOut.PacketNum);
    if (Window.InvalidElement(element))
    {
        // Set default return value
        packetOut.Data      = nullptr;
        packetOut.DataBytes = 0;
        return Siamese_NeedMoreData;
    }

    // Return the packet data
    OriginalPacket* original = Window.GetWindowElement(element);
    if (original->Buffer.Bytes <= 0)
    {
        packetOut.Data      = nullptr;
        packetOut.DataBytes = 0;
        return Siamese_NeedMoreData;
    }

    const unsigned headerBytes = original->HeaderBytes;
    SIAMESE_DEBUG_ASSERT(headerBytes > 0 && original->Buffer.Bytes > headerBytes);
    const unsigned length = original->Buffer.Bytes - headerBytes;

#ifdef SIAMESE_DEBUG
    // Check: Deserialize length from the front
    unsigned lengthCheck;
    int headerBytesCheck = DeserializeHeader_PacketLength(
        original->Buffer.Data,
        original->Buffer.Bytes,
        lengthCheck);

    if (lengthCheck != length || (int)headerBytes != headerBytesCheck ||
        headerBytesCheck < 1 || lengthCheck == 0 ||
        lengthCheck + headerBytesCheck != original->Buffer.Bytes)
    {
        SIAMESE_DEBUG_BREAK(); // Invalid input
        Window.EmergencyDisabled = true;
        return Siamese_Disabled;
    }
#endif // SIAMESE_DEBUG

    packetOut.Data      = original->Buffer.Data + headerBytes;
    packetOut.DataBytes = length;
    return Siamese_Success;
}